

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb_tests.cpp
# Opt level: O2

void __thiscall
wallet::walletdb_tests::walletdb_read_write_deadlock::test_method
          (walletdb_read_write_deadlock *this)

{
  Chain *chain;
  bool bVar1;
  int iVar2;
  CWallet *this_00;
  LegacyScriptPubKeyMan *pLVar3;
  long lVar4;
  bilingual_str *error;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  string *psVar7;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  long *local_198;
  shared_ptr<wallet::CWallet> wallet;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  long *local_150;
  DatabaseStatus status;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  string local_130;
  path local_110;
  undefined1 local_e8 [40];
  bilingual_str error_string;
  DatabaseOptions local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  while( true ) {
    error = &error_string;
    if (lVar4 == 4) break;
    local_80.require_existing = false;
    local_80.require_create = false;
    local_80.create_flags = 0;
    local_80.create_passphrase._M_dataplus._M_p = (pointer)&local_80.create_passphrase.field_2;
    local_80.create_passphrase._M_string_length = 0;
    local_80.create_passphrase.field_2._M_local_buf[0] = '\0';
    local_80.verify = true;
    local_80.use_unsafe_sync = false;
    local_80.use_shared_memory = false;
    error_string.original._M_dataplus._M_p = (pointer)&error_string.original.field_2;
    error_string.original._M_string_length = 0;
    local_80.max_log_mb = 100;
    local_80.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::DatabaseFormat> =
         (_Optional_base<wallet::DatabaseFormat,_true,_true>)
         (_Optional_payload<wallet::DatabaseFormat,_true,_true,_true>)0x100000001;
    error_string.original.field_2._M_local_buf[0] = '\0';
    error_string.translated._M_dataplus._M_p = (pointer)&error_string.translated.field_2;
    error_string.translated._M_string_length = 0;
    error_string.translated.field_2._M_local_buf[0] = '\0';
    std::filesystem::__cxx11::path::path
              (&local_110,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path);
    tinyformat::format<wallet::DatabaseFormat>
              (&local_130,"wallet_%d_.dat",(DatabaseFormat *)((long)&DATABASE_FORMATS + lVar4));
    fs::path::operator/=
              ((path *)&local_110,
               (char *)CONCAT44(local_130._M_dataplus._M_p._4_4_,local_130._M_dataplus._M_p._0_4_));
    std::filesystem::__cxx11::path::path((path *)local_e8,&local_110);
    MakeDatabase((wallet *)&local_150,(path *)local_e8,&local_80,&status,error);
    std::filesystem::__cxx11::path::~path((path *)local_e8);
    std::__cxx11::string::~string((string *)&local_130);
    std::filesystem::__cxx11::path::~path(&local_110);
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2a;
    file.m_begin = (iterator)&local_160;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)error;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
    local_e8[8] = 0;
    local_e8._0_8_ = &PTR__lazy_ostream_011480b0;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_e8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_178 = "";
    local_130._M_dataplus._M_p._0_4_ = 0;
    psVar7 = &local_130;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DatabaseStatus,wallet::DatabaseStatus>
              ((path *)local_e8,&local_180,0x2a,1,2,&status,"status",&local_130,
               "DatabaseStatus::SUCCESS");
    this_00 = (CWallet *)operator_new(0x4a8);
    chain = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.chain._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"",(allocator<char> *)&local_130);
    local_198 = local_150;
    local_150 = (long *)0x0;
    CWallet::CWallet(this_00,chain,(string *)local_e8,
                     (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      )&local_198);
    std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<wallet::CWallet,void>
              ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&wallet,this_00);
    if (local_198 != (long *)0x0) {
      (**(code **)(*local_198 + 8))();
    }
    local_198 = (long *)0x0;
    std::__cxx11::string::~string((string *)local_e8);
    (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_keypool_size
         = 4;
    pvVar5 = (iterator)0x30;
    pvVar6 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock6,
               &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                cs_wallet,"wallet->cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
               ,0x30,false);
    pLVar3 = CWallet::GetOrCreateLegacyScriptPubKeyMan
                       (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = &DAT_00000032;
    file_00.m_begin = (iterator)&local_1a8;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b8,
               msg_00);
    iVar2 = (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb])
                      (pLVar3,1);
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity = 0;
    local_1c8 = "legacy_spkm->SetupGeneration(true)";
    local_1c0 = "";
    local_e8[8] = 0;
    local_e8._0_8_ = &PTR__lazy_ostream_011481f0;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_e8._24_8_ = &local_1c8;
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_1d0 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    local_130._M_dataplus._M_p._0_1_ = (char)iVar2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_130,(lazy_ostream *)local_e8,1,0,WARN,(check_type)psVar7,
               (size_t)&local_1d8,0x32);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_130.field_2._M_allocated_capacity);
    CWallet::Flush(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x36;
    file_01.m_begin = (iterator)&local_1e8;
    msg_01.m_end = pvVar6;
    msg_01.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
               msg_01);
    pLVar3 = CWallet::GetLegacyScriptPubKeyMan
                       (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    bVar1 = LegacyDataSPKM::DeleteRecords(&pLVar3->super_LegacyDataSPKM);
    local_130._M_dataplus._M_p._0_4_ = CONCAT31(local_130._M_dataplus._M_p._1_3_,bVar1);
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity = 0;
    local_1c8 = "wallet->GetLegacyScriptPubKeyMan()->DeleteRecords()";
    local_1c0 = "";
    local_e8[8] = 0;
    local_e8._0_8_ = &PTR__lazy_ostream_011481f0;
    local_e8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_e8._24_8_ = &local_1c8;
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
    ;
    local_200 = "";
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_130,(lazy_ostream *)local_e8,1,0,WARN,(check_type)psVar7,
               (size_t)&local_208,0x36);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_130.field_2._M_allocated_capacity);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock6.super_unique_lock);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (local_150 != (long *)0x0) {
      (**(code **)(*local_150 + 8))();
    }
    bilingual_str::~bilingual_str(&error_string);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
              (&local_80.create_passphrase);
    lVar4 = lVar4 + 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletdb_read_write_deadlock)
{
    // Exercises a db read write operation that shouldn't deadlock.
    for (const DatabaseFormat& db_format : DATABASE_FORMATS) {
        // Context setup
        DatabaseOptions options;
        options.require_format = db_format;
        DatabaseStatus status;
        bilingual_str error_string;
        std::unique_ptr<WalletDatabase> db = MakeDatabase(m_path_root / strprintf("wallet_%d_.dat", db_format).c_str(), options, status, error_string);
        BOOST_CHECK_EQUAL(status, DatabaseStatus::SUCCESS);

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(db)));
        wallet->m_keypool_size = 4;

        // Create legacy spkm
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));
        wallet->Flush();

        // Now delete all records, which performs a read write operation.
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
    }
}